

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# micro_string.h
# Opt level: O0

string_view __thiscall google::protobuf::internal::MicroString::Get(MicroString *this)

{
  bool bVar1;
  MicroRep *this_00;
  LargeRep *this_01;
  MicroString *this_local;
  
  bVar1 = is_micro_rep(this);
  if (bVar1) {
    this_00 = micro_rep(this);
    _this_local = MicroRep::view(this_00);
  }
  else {
    bVar1 = is_inline(this);
    if (bVar1) {
      _this_local = inline_view(this);
    }
    else {
      this_01 = large_rep(this);
      _this_local = LargeRep::view(this_01);
    }
  }
  return _this_local;
}

Assistant:

absl::string_view Get() const {
    if (is_micro_rep()) {
      return micro_rep()->view();
    } else if (is_inline()) {
      return inline_view();
    } else {
      return large_rep()->view();
    }
  }